

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O0

char * __thiscall opencollada::MissingArgumentException::what(MissingArgumentException *this)

{
  long lVar1;
  char *pcVar2;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  char *in_stack_00000018;
  string local_28 [40];
  
  ::std::__cxx11::string::operator=((string *)(in_RDI + 0x28),"Missing argument");
  lVar1 = ::std::__cxx11::string::length();
  if (lVar1 != 0) {
    ::std::operator+(in_stack_00000018,in_stack_00000010);
    ::std::__cxx11::string::operator+=((string *)(in_RDI + 0x28),local_28);
    ::std::__cxx11::string::~string(local_28);
  }
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

virtual const char* what() const NOEXCEPT override
        {
			mWhat = "Missing argument";
			if (mParam.length() > 0)
				mWhat += ": " + mParam;
            return mWhat.c_str();
        }